

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O1

void __thiscall LatencyItem::LatencyItem(LatencyItem *this,LatencyItem *src)

{
  pointer pcVar1;
  
  (this->statName)._M_dataplus._M_p = (pointer)&(this->statName).field_2;
  pcVar1 = (src->statName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (src->statName)._M_string_length);
  Histogram::Histogram(&this->hist,&src->hist);
  return;
}

Assistant:

LatencyItem(const LatencyItem& src)
        : statName(src.statName)
        , hist(src.hist) {}